

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::setTotalMass(btSoftBody *this,btScalar mass,bool fromfaces)

{
  uint uVar1;
  Node *pNVar2;
  Face *pFVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  long lVar8;
  long lVar9;
  btScalar bVar10;
  
  uVar1 = (this->m_nodes).m_size;
  if ((int)CONCAT71(in_register_00000031,fromfaces) == 0) {
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
  }
  else {
    pNVar2 = (this->m_nodes).m_data;
    uVar6 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 * 0x78 - uVar6 != 0; uVar6 = uVar6 + 0x78) {
      *(undefined4 *)((long)(&pNVar2->m_n + 1) + uVar6) = 0;
    }
    lVar8 = 0x10;
    for (lVar9 = 0; lVar9 < (this->m_faces).m_size; lVar9 = lVar9 + 1) {
      pFVar3 = (this->m_faces).m_data;
      bVar10 = AreaOf(&pFVar3[lVar9].m_n[0]->m_x,&pFVar3[lVar9].m_n[1]->m_x,
                      &pFVar3[lVar9].m_n[2]->m_x);
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        lVar4 = *(long *)((long)pFVar3->m_n + lVar5 * 8 + lVar8 + -0x10);
        *(float *)(lVar4 + 0x60) = *(float *)(lVar4 + 0x60) + bVar10;
      }
      lVar8 = lVar8 + 0x48;
    }
    uVar1 = (this->m_nodes).m_size;
    pNVar2 = (this->m_nodes).m_data;
    uVar6 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 * 0x78 - uVar6 != 0; uVar6 = uVar6 + 0x78) {
      *(float *)((long)(&pNVar2->m_n + 1) + uVar6) =
           1.0 / *(float *)((long)(&pNVar2->m_n + 1) + uVar6);
    }
  }
  bVar10 = getTotalMass(this);
  pNVar2 = (this->m_nodes).m_data;
  for (lVar8 = 0; uVar7 * 0x78 - lVar8 != 0; lVar8 = lVar8 + 0x78) {
    *(float *)((long)(&pNVar2->m_n + 1) + lVar8) =
         *(float *)((long)(&pNVar2->m_n + 1) + lVar8) / ((1.0 / bVar10) * mass);
  }
  this->m_bUpdateRtCst = true;
  return;
}

Assistant:

void			btSoftBody::setTotalMass(btScalar mass,bool fromfaces)
{
	int i;

	if(fromfaces)
	{

		for(i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=0;
		}
		for(i=0;i<m_faces.size();++i)
		{
			const Face&		f=m_faces[i];
			const btScalar	twicearea=AreaOf(	f.m_n[0]->m_x,
				f.m_n[1]->m_x,
				f.m_n[2]->m_x);
			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_im+=twicearea;
			}
		}
		for( i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=1/m_nodes[i].m_im;
		}
	}
	const btScalar	tm=getTotalMass();
	const btScalar	itm=1/tm;
	for( i=0;i<m_nodes.size();++i)
	{
		m_nodes[i].m_im/=itm*mass;
	}
	m_bUpdateRtCst=true;
}